

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O0

void grpc_cpp_generator::anon_unknown_3::PrintHeaderClientMethodInterfaces
               (Printer *printer,Method *method,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars,bool is_public)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  byte bVar2;
  bool bVar3;
  mapped_type *pmVar4;
  string *psVar5;
  __0 *local_858;
  allocator<char> local_511;
  key_type local_510;
  allocator<char> local_4e9;
  key_type local_4e8;
  string *local_4c8;
  anon_struct_96_3_3738e6c4 *async_prefix_7;
  size_t i_7;
  key_type local_4b0;
  allocator<char> local_489;
  key_type local_488;
  string *local_468;
  anon_struct_96_3_3738e6c4 *async_prefix_6;
  size_t i_6;
  key_type local_450;
  allocator<char> local_429;
  key_type local_428;
  string *local_408;
  anon_struct_96_3_3738e6c4 *async_prefix_5;
  size_t i_5;
  key_type local_3f0;
  string *local_3d0;
  anon_struct_96_3_3738e6c4 *async_prefix_4;
  size_t i_4;
  key_type local_3b8;
  allocator<char> local_391;
  key_type local_390;
  allocator<char> local_369;
  key_type local_368;
  string *local_348;
  anon_struct_96_3_3738e6c4 *async_prefix_3;
  size_t i_3;
  key_type local_330;
  allocator<char> local_309;
  key_type local_308;
  allocator<char> local_2e1;
  key_type local_2e0;
  string *local_2c0;
  anon_struct_96_3_3738e6c4 *async_prefix_2;
  size_t i_2;
  key_type local_2a8;
  allocator<char> local_281;
  key_type local_280;
  allocator<char> local_259;
  key_type local_258;
  string *local_238;
  anon_struct_96_3_3738e6c4 *async_prefix_1;
  size_t i_1;
  key_type local_220;
  string *local_200;
  anon_struct_96_3_3738e6c4 *async_prefix;
  size_t i;
  allocator<char> local_1e8;
  allocator<char> local_1e7;
  allocator<char> local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  allocator<char> local_1e3;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  string *local_1e0;
  string local_1d8 [8];
  anon_struct_96_3_3738e6c4 async_prefixes [2];
  allocator<char> local_109;
  key_type local_108;
  string local_e8 [39];
  allocator<char> local_c1;
  key_type local_c0;
  string local_a0 [55];
  allocator<char> local_69;
  key_type local_68;
  string local_48 [39];
  byte local_21;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmStack_20;
  bool is_public_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars_local;
  Method *method_local;
  Printer *printer_local;
  
  local_21 = is_public;
  pmStack_20 = vars;
  vars_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)method;
  method_local = (Method *)printer;
  (*(method->super_CommentHolder)._vptr_CommentHolder[5])(local_48);
  pmVar1 = pmStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Method",&local_69);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_68);
  std::__cxx11::string::operator=((string *)pmVar4,local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string(local_48);
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))(local_a0);
  pmVar1 = pmStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Request",&local_c1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar4,local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string(local_a0);
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x38))(local_e8);
  pmVar1 = pmStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Response",&local_109);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_108);
  std::__cxx11::string::operator=((string *)pmVar4,local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_e8);
  i._5_1_ = 1;
  local_1e0 = local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"Async",&local_1e1);
  local_1e5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(async_prefixes[0].prefix.field_2._M_local_buf + 8),", void* tag",&local_1e2)
  ;
  local_1e4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(async_prefixes[0].method_params.field_2._M_local_buf + 8),", tag",&local_1e3
            );
  local_1e4 = 0;
  local_1e5 = 0;
  psVar5 = (string *)(async_prefixes[0].raw_args.field_2._M_local_buf + 8);
  local_1e0 = psVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar5,"PrepareAsync",&local_1e6);
  i._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(async_prefixes[1].prefix.field_2._M_local_buf + 8),"",&local_1e7);
  i._7_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(async_prefixes[1].method_params.field_2._M_local_buf + 8),"",&local_1e8);
  i._7_1_ = 0;
  i._6_1_ = 0;
  i._5_1_ = 0;
  std::allocator<char>::~allocator(&local_1e8);
  std::allocator<char>::~allocator(&local_1e7);
  std::allocator<char>::~allocator(&local_1e6);
  std::allocator<char>::~allocator(&local_1e3);
  std::allocator<char>::~allocator(&local_1e2);
  std::allocator<char>::~allocator(&local_1e1);
  if ((local_21 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x78))();
    if ((bVar2 & 1) == 0) {
      bVar3 = ClientOnlyStreaming((Method *)vars_local);
      if (bVar3) {
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                  (method_local,pmStack_20,
                   "virtual ::grpc::ClientWriterInterface< $Request$>* $Method$Raw(::grpc::ClientContext* context, $Response$* response) = 0;\n"
                  );
        for (async_prefix_5 = (anon_struct_96_3_3738e6c4 *)0x0; pmVar1 = pmStack_20,
            async_prefix_5 < (anon_struct_96_3_3738e6c4 *)0x2;
            async_prefix_5 = (anon_struct_96_3_3738e6c4 *)&(async_prefix_5->prefix).field_0x1) {
          psVar5 = (string *)
                   (async_prefixes
                    [(long)&async_prefix_5[-1].raw_args.field_2._M_allocated_capacity + 0xf].
                    raw_args.field_2._M_local_buf + 8);
          local_408 = psVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"AsyncPrefix",&local_429);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_428);
          std::__cxx11::string::operator=((string *)pmVar4,psVar5);
          std::__cxx11::string::~string((string *)&local_428);
          std::allocator<char>::~allocator(&local_429);
          pmVar1 = pmStack_20;
          psVar5 = local_408 + 0x20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,"AsyncMethodParams",(allocator<char> *)((long)&i_6 + 7));
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_450);
          std::__cxx11::string::operator=((string *)pmVar4,psVar5);
          std::__cxx11::string::~string((string *)&local_450);
          std::allocator<char>::~allocator((allocator<char> *)((long)&i_6 + 7));
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                    (method_local,pmStack_20,
                     "virtual ::grpc::ClientAsyncWriterInterface< $Request$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, $Response$* response, ::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n"
                    );
        }
      }
      else {
        bVar3 = ServerOnlyStreaming((Method *)vars_local);
        if (bVar3) {
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                    (method_local,pmStack_20,
                     "virtual ::grpc::ClientReaderInterface< $Response$>* $Method$Raw(::grpc::ClientContext* context, const $Request$& request) = 0;\n"
                    );
          for (async_prefix_6 = (anon_struct_96_3_3738e6c4 *)0x0; pmVar1 = pmStack_20,
              async_prefix_6 < (anon_struct_96_3_3738e6c4 *)0x2;
              async_prefix_6 = (anon_struct_96_3_3738e6c4 *)&(async_prefix_6->prefix).field_0x1) {
            psVar5 = (string *)
                     (async_prefixes
                      [(long)&async_prefix_6[-1].raw_args.field_2._M_allocated_capacity + 0xf].
                      raw_args.field_2._M_local_buf + 8);
            local_468 = psVar5;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_488,"AsyncPrefix",&local_489);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](pmVar1,&local_488);
            std::__cxx11::string::operator=((string *)pmVar4,psVar5);
            std::__cxx11::string::~string((string *)&local_488);
            std::allocator<char>::~allocator(&local_489);
            pmVar1 = pmStack_20;
            psVar5 = local_468 + 0x20;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4b0,"AsyncMethodParams",(allocator<char> *)((long)&i_7 + 7))
            ;
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](pmVar1,&local_4b0);
            std::__cxx11::string::operator=((string *)pmVar4,psVar5);
            std::__cxx11::string::~string((string *)&local_4b0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&i_7 + 7));
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                      (method_local,pmStack_20,
                       "virtual ::grpc::ClientAsyncReaderInterface< $Response$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n"
                      );
          }
        }
        else {
          bVar2 = (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x90))();
          if ((bVar2 & 1) != 0) {
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                      (method_local,pmStack_20,
                       "virtual ::grpc::ClientReaderWriterInterface< $Request$, $Response$>* $Method$Raw(::grpc::ClientContext* context) = 0;\n"
                      );
            for (async_prefix_7 = (anon_struct_96_3_3738e6c4 *)0x0; pmVar1 = pmStack_20,
                async_prefix_7 < (anon_struct_96_3_3738e6c4 *)0x2;
                async_prefix_7 = (anon_struct_96_3_3738e6c4 *)&(async_prefix_7->prefix).field_0x1) {
              psVar5 = (string *)
                       (async_prefixes
                        [(long)&async_prefix_7[-1].raw_args.field_2._M_allocated_capacity + 0xf].
                        raw_args.field_2._M_local_buf + 8);
              local_4c8 = psVar5;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4e8,"AsyncPrefix",&local_4e9);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](pmVar1,&local_4e8);
              std::__cxx11::string::operator=((string *)pmVar4,psVar5);
              std::__cxx11::string::~string((string *)&local_4e8);
              std::allocator<char>::~allocator(&local_4e9);
              pmVar1 = pmStack_20;
              psVar5 = local_4c8 + 0x20;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_510,"AsyncMethodParams",&local_511);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](pmVar1,&local_510);
              std::__cxx11::string::operator=((string *)pmVar4,psVar5);
              std::__cxx11::string::~string((string *)&local_510);
              std::allocator<char>::~allocator(&local_511);
              (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                        (method_local,pmStack_20,
                         "virtual ::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, ::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n"
                        );
            }
          }
        }
      }
    }
    else {
      for (async_prefix_4 = (anon_struct_96_3_3738e6c4 *)0x0; pmVar1 = pmStack_20,
          async_prefix_4 < (anon_struct_96_3_3738e6c4 *)0x2;
          async_prefix_4 = (anon_struct_96_3_3738e6c4 *)&(async_prefix_4->prefix).field_0x1) {
        psVar5 = (string *)
                 (async_prefixes
                  [(long)&async_prefix_4[-1].raw_args.field_2._M_allocated_capacity + 0xf].raw_args.
                  field_2._M_local_buf + 8);
        local_3d0 = psVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"AsyncPrefix",(allocator<char> *)((long)&i_5 + 7));
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_3f0);
        std::__cxx11::string::operator=((string *)pmVar4,psVar5);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_5 + 7));
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                  (method_local,pmStack_20,
                   "virtual ::grpc::ClientAsyncResponseReaderInterface< $Response$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq) = 0;\n"
                  );
      }
    }
  }
  else {
    bVar2 = (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x78))();
    if ((bVar2 & 1) == 0) {
      bVar3 = ClientOnlyStreaming((Method *)vars_local);
      if (bVar3) {
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                  (method_local,pmStack_20,
                   "std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>> $Method$(::grpc::ClientContext* context, $Response$* response) {\n"
                  );
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[5])();
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                  (method_local,pmStack_20,
                   "return std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>>($Method$Raw(context, response));\n"
                  );
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[6])();
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[3])(method_local,"}\n");
        for (async_prefix_1 = (anon_struct_96_3_3738e6c4 *)0x0; pmVar1 = pmStack_20,
            async_prefix_1 < (anon_struct_96_3_3738e6c4 *)0x2;
            async_prefix_1 = (anon_struct_96_3_3738e6c4 *)&(async_prefix_1->prefix).field_0x1) {
          psVar5 = (string *)
                   (async_prefixes
                    [(long)&async_prefix_1[-1].raw_args.field_2._M_allocated_capacity + 0xf].
                    raw_args.field_2._M_local_buf + 8);
          local_238 = psVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"AsyncPrefix",&local_259);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_258);
          std::__cxx11::string::operator=((string *)pmVar4,psVar5);
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator(&local_259);
          pmVar1 = pmStack_20;
          psVar5 = local_238 + 0x20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,"AsyncMethodParams",&local_281);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_280);
          std::__cxx11::string::operator=((string *)pmVar4,psVar5);
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator(&local_281);
          pmVar1 = pmStack_20;
          psVar5 = local_238 + 0x40;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,"AsyncRawArgs",(allocator<char> *)((long)&i_2 + 7));
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_2a8);
          std::__cxx11::string::operator=((string *)pmVar4,psVar5);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 7));
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                    (method_local,pmStack_20,
                     "std::unique_ptr< ::grpc::ClientAsyncWriterInterface< $Request$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, $Response$* response, ::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n"
                    );
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[5])();
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                    (method_local,pmStack_20,
                     "return std::unique_ptr< ::grpc::ClientAsyncWriterInterface< $Request$>>($AsyncPrefix$$Method$Raw(context, response, cq$AsyncRawArgs$));\n"
                    );
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[6])();
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[3])(method_local,"}\n");
        }
      }
      else {
        bVar3 = ServerOnlyStreaming((Method *)vars_local);
        if (bVar3) {
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                    (method_local,pmStack_20,
                     "std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>> $Method$(::grpc::ClientContext* context, const $Request$& request) {\n"
                    );
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[5])();
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                    (method_local,pmStack_20,
                     "return std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>>($Method$Raw(context, request));\n"
                    );
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[6])();
          (*(method_local->super_CommentHolder)._vptr_CommentHolder[3])(method_local,"}\n");
          for (async_prefix_2 = (anon_struct_96_3_3738e6c4 *)0x0; pmVar1 = pmStack_20,
              async_prefix_2 < (anon_struct_96_3_3738e6c4 *)0x2;
              async_prefix_2 = (anon_struct_96_3_3738e6c4 *)&(async_prefix_2->prefix).field_0x1) {
            psVar5 = (string *)
                     (async_prefixes
                      [(long)&async_prefix_2[-1].raw_args.field_2._M_allocated_capacity + 0xf].
                      raw_args.field_2._M_local_buf + 8);
            local_2c0 = psVar5;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e0,"AsyncPrefix",&local_2e1);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](pmVar1,&local_2e0);
            std::__cxx11::string::operator=((string *)pmVar4,psVar5);
            std::__cxx11::string::~string((string *)&local_2e0);
            std::allocator<char>::~allocator(&local_2e1);
            pmVar1 = pmStack_20;
            psVar5 = local_2c0 + 0x20;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_308,"AsyncMethodParams",&local_309);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](pmVar1,&local_308);
            std::__cxx11::string::operator=((string *)pmVar4,psVar5);
            std::__cxx11::string::~string((string *)&local_308);
            std::allocator<char>::~allocator(&local_309);
            pmVar1 = pmStack_20;
            psVar5 = local_2c0 + 0x40;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_330,"AsyncRawArgs",(allocator<char> *)((long)&i_3 + 7));
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](pmVar1,&local_330);
            std::__cxx11::string::operator=((string *)pmVar4,psVar5);
            std::__cxx11::string::~string((string *)&local_330);
            std::allocator<char>::~allocator((allocator<char> *)((long)&i_3 + 7));
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                      (method_local,pmStack_20,
                       "std::unique_ptr< ::grpc::ClientAsyncReaderInterface< $Response$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n"
                      );
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[5])();
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                      (method_local,pmStack_20,
                       "return std::unique_ptr< ::grpc::ClientAsyncReaderInterface< $Response$>>($AsyncPrefix$$Method$Raw(context, request, cq$AsyncRawArgs$));\n"
                      );
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[6])();
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[3])(method_local,"}\n");
          }
        }
        else {
          bVar2 = (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x90))();
          if ((bVar2 & 1) != 0) {
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                      (method_local,pmStack_20,
                       "std::unique_ptr< ::grpc::ClientReaderWriterInterface< $Request$, $Response$>> $Method$(::grpc::ClientContext* context) {\n"
                      );
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[5])();
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                      (method_local,pmStack_20,
                       "return std::unique_ptr< ::grpc::ClientReaderWriterInterface< $Request$, $Response$>>($Method$Raw(context));\n"
                      );
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[6])();
            (*(method_local->super_CommentHolder)._vptr_CommentHolder[3])(method_local,"}\n");
            for (async_prefix_3 = (anon_struct_96_3_3738e6c4 *)0x0; pmVar1 = pmStack_20,
                async_prefix_3 < (anon_struct_96_3_3738e6c4 *)0x2;
                async_prefix_3 = (anon_struct_96_3_3738e6c4 *)&(async_prefix_3->prefix).field_0x1) {
              psVar5 = (string *)
                       (async_prefixes
                        [(long)&async_prefix_3[-1].raw_args.field_2._M_allocated_capacity + 0xf].
                        raw_args.field_2._M_local_buf + 8);
              local_348 = psVar5;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_368,"AsyncPrefix",&local_369);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](pmVar1,&local_368);
              std::__cxx11::string::operator=((string *)pmVar4,psVar5);
              std::__cxx11::string::~string((string *)&local_368);
              std::allocator<char>::~allocator(&local_369);
              pmVar1 = pmStack_20;
              psVar5 = local_348 + 0x20;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_390,"AsyncMethodParams",&local_391);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](pmVar1,&local_390);
              std::__cxx11::string::operator=((string *)pmVar4,psVar5);
              std::__cxx11::string::~string((string *)&local_390);
              std::allocator<char>::~allocator(&local_391);
              pmVar1 = pmStack_20;
              psVar5 = local_348 + 0x40;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3b8,"AsyncRawArgs",(allocator<char> *)((long)&i_4 + 7));
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](pmVar1,&local_3b8);
              std::__cxx11::string::operator=((string *)pmVar4,psVar5);
              std::__cxx11::string::~string((string *)&local_3b8);
              std::allocator<char>::~allocator((allocator<char> *)((long)&i_4 + 7));
              (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                        (method_local,pmStack_20,
                         "std::unique_ptr< ::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, ::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n"
                        );
              (*(method_local->super_CommentHolder)._vptr_CommentHolder[5])();
              (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                        (method_local,pmStack_20,
                         "return std::unique_ptr< ::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>>($AsyncPrefix$$Method$Raw(context, cq$AsyncRawArgs$));\n"
                        );
              (*(method_local->super_CommentHolder)._vptr_CommentHolder[6])();
              (*(method_local->super_CommentHolder)._vptr_CommentHolder[3])(method_local,"}\n");
            }
          }
        }
      }
    }
    else {
      (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                (method_local,pmStack_20,
                 "virtual ::grpc::Status $Method$(::grpc::ClientContext* context, const $Request$& request, $Response$* response) = 0;\n"
                );
      for (async_prefix = (anon_struct_96_3_3738e6c4 *)0x0; pmVar1 = pmStack_20,
          async_prefix < (anon_struct_96_3_3738e6c4 *)0x2;
          async_prefix = (anon_struct_96_3_3738e6c4 *)&(async_prefix->prefix).field_0x1) {
        psVar5 = (string *)
                 (async_prefixes
                  [(long)&async_prefix[-1].raw_args.field_2._M_allocated_capacity + 0xf].raw_args.
                  field_2._M_local_buf + 8);
        local_200 = psVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"AsyncPrefix",(allocator<char> *)((long)&i_1 + 7));
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_220);
        std::__cxx11::string::operator=((string *)pmVar4,psVar5);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                  (method_local,pmStack_20,
                   "std::unique_ptr< ::grpc::ClientAsyncResponseReaderInterface< $Response$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq) {\n"
                  );
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[5])();
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[2])
                  (method_local,pmStack_20,
                   "return std::unique_ptr< ::grpc::ClientAsyncResponseReaderInterface< $Response$>>($AsyncPrefix$$Method$Raw(context, request, cq));\n"
                  );
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[6])();
        (*(method_local->super_CommentHolder)._vptr_CommentHolder[3])(method_local,"}\n");
      }
    }
  }
  local_858 = (__0 *)(async_prefixes[1].raw_args.field_2._M_local_buf + 8);
  do {
    local_858 = local_858 + -0x60;
    (anonymous_namespace)::
    PrintHeaderClientMethodInterfaces(grpc_generator::Printer*,grpc_generator::Method_const*,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>*,bool)
    ::$_0::~__0(local_858);
  } while (local_858 != (__0 *)local_1d8);
  return;
}

Assistant:

static void PrintHeaderClientMethodInterfaces(
    grpc_generator::Printer *printer, const grpc_generator::Method *method,
    std::map<grpc::string, grpc::string> *vars, bool is_public) {
  (*vars)["Method"] = method->name();
  (*vars)["Request"] = method->input_type_name();
  (*vars)["Response"] = method->output_type_name();

  struct {
    grpc::string prefix;
    grpc::string method_params;  // extra arguments to method
    grpc::string raw_args;       // extra arguments to raw version of method
  } async_prefixes[] = { { "Async", ", void* tag", ", tag" },
                         { "PrepareAsync", "", "" } };

  if (is_public) {
    if (method->NoStreaming()) {
      printer->Print(
          *vars,
          "virtual ::grpc::Status $Method$(::grpc::ClientContext* context, "
          "const $Request$& request, $Response$* response) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        printer->Print(
            *vars,
            "std::unique_ptr< "
            "::grpc::ClientAsyncResponseReaderInterface< $Response$>> "
            "$AsyncPrefix$$Method$(::grpc::ClientContext* context, "
            "const $Request$& request, "
            "::grpc::CompletionQueue* cq) {\n");
        printer->Indent();
        printer->Print(
            *vars,
            "return std::unique_ptr< "
            "::grpc::ClientAsyncResponseReaderInterface< $Response$>>("
            "$AsyncPrefix$$Method$Raw(context, request, cq));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    } else if (ClientOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>>"
          " $Method$("
          "::grpc::ClientContext* context, $Response$* response) {\n");
      printer->Indent();
      printer->Print(
          *vars,
          "return std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>>"
          "($Method$Raw(context, response));\n");
      printer->Outdent();
      printer->Print("}\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        (*vars)["AsyncRawArgs"] = async_prefix.raw_args;
        printer->Print(
            *vars,
            "std::unique_ptr< ::grpc::ClientAsyncWriterInterface< $Request$>>"
            " $AsyncPrefix$$Method$(::grpc::ClientContext* context, "
            "$Response$* "
            "response, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n");
        printer->Indent();
        printer->Print(*vars,
                       "return std::unique_ptr< "
                       "::grpc::ClientAsyncWriterInterface< $Request$>>("
                       "$AsyncPrefix$$Method$Raw(context, response, "
                       "cq$AsyncRawArgs$));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    } else if (ServerOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>>"
          " $Method$(::grpc::ClientContext* context, const $Request$& request)"
          " {\n");
      printer->Indent();
      printer->Print(
          *vars,
          "return std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>>"
          "($Method$Raw(context, request));\n");
      printer->Outdent();
      printer->Print("}\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        (*vars)["AsyncRawArgs"] = async_prefix.raw_args;
        printer->Print(
            *vars,
            "std::unique_ptr< ::grpc::ClientAsyncReaderInterface< $Response$>> "
            "$AsyncPrefix$$Method$("
            "::grpc::ClientContext* context, const $Request$& request, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n");
        printer->Indent();
        printer->Print(
            *vars,
            "return std::unique_ptr< "
            "::grpc::ClientAsyncReaderInterface< $Response$>>("
            "$AsyncPrefix$$Method$Raw(context, request, cq$AsyncRawArgs$));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    } else if (method->BidiStreaming()) {
      printer->Print(*vars,
                     "std::unique_ptr< ::grpc::ClientReaderWriterInterface< "
                     "$Request$, $Response$>> "
                     "$Method$(::grpc::ClientContext* context) {\n");
      printer->Indent();
      printer->Print(
          *vars,
          "return std::unique_ptr< "
          "::grpc::ClientReaderWriterInterface< $Request$, $Response$>>("
          "$Method$Raw(context));\n");
      printer->Outdent();
      printer->Print("}\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        (*vars)["AsyncRawArgs"] = async_prefix.raw_args;
        printer->Print(
            *vars,
            "std::unique_ptr< "
            "::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>> "
            "$AsyncPrefix$$Method$(::grpc::ClientContext* context, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n");
        printer->Indent();
        printer->Print(
            *vars,
            "return std::unique_ptr< "
            "::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>>("
            "$AsyncPrefix$$Method$Raw(context, cq$AsyncRawArgs$));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  } else {
    if (method->NoStreaming()) {
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncResponseReaderInterface< $Response$>* "
            "$AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, "
            "const $Request$& request, "
            "::grpc::CompletionQueue* cq) = 0;\n");
      }
    } else if (ClientOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "virtual ::grpc::ClientWriterInterface< $Request$>*"
          " $Method$Raw("
          "::grpc::ClientContext* context, $Response$* response) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncWriterInterface< $Request$>*"
            " $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, "
            "$Response$* response, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n");
      }
    } else if (ServerOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "virtual ::grpc::ClientReaderInterface< $Response$>* "
          "$Method$Raw("
          "::grpc::ClientContext* context, const $Request$& request) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncReaderInterface< $Response$>* "
            "$AsyncPrefix$$Method$Raw("
            "::grpc::ClientContext* context, const $Request$& request, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n");
      }
    } else if (method->BidiStreaming()) {
      printer->Print(*vars,
                     "virtual ::grpc::ClientReaderWriterInterface< $Request$, "
                     "$Response$>* "
                     "$Method$Raw(::grpc::ClientContext* context) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncReaderWriterInterface< "
            "$Request$, $Response$>* "
            "$AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n");
      }
    }
  }
}